

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccessmanager.cpp
# Opt level: O1

QNetworkReply * __thiscall
QNetworkAccessManager::put
          (QNetworkAccessManager *this,QNetworkRequest *request,QHttpMultiPart *multiPart)

{
  QNetworkAccessManagerPrivate *this_00;
  QNetworkReply *reply;
  long in_FS_OFFSET;
  QNetworkRequest newRequest;
  undefined1 *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  QNetworkAccessManagerPrivate::prepareMultipart
            ((QNetworkAccessManagerPrivate *)&local_30,request,(QHttpMultiPart *)request);
  this_00 = *(QNetworkAccessManagerPrivate **)(this + 8);
  reply = (QNetworkReply *)
          (**(code **)(*(long *)this + 0x68))
                    (this,3,(QNetworkAccessManagerPrivate *)&local_30,
                     *(undefined8 *)(*(long *)&multiPart->field_0x8 + 0xb0));
  QNetworkAccessManagerPrivate::postProcess(this_00,reply);
  QNetworkRequest::~QNetworkRequest((QNetworkRequest *)&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return reply;
  }
  __stack_chk_fail();
}

Assistant:

QNetworkReply *QNetworkAccessManager::put(const QNetworkRequest &request, QHttpMultiPart *multiPart)
{
    QNetworkRequest newRequest = d_func()->prepareMultipart(request, multiPart);
    QIODevice *device = multiPart->d_func()->device;
    QNetworkReply *reply = put(newRequest, device);
    return reply;
}